

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_console.hpp
# Opt level: O0

bool iutest::detail::iuConsole::IsShouldUseColor(bool use_color)

{
  bool bVar1;
  int iVar2;
  byte local_1e;
  bool local_9;
  bool use_color_local;
  
  bVar1 = IsColorModeOn();
  if (bVar1) {
    local_9 = true;
  }
  else {
    bVar1 = IsColorModeOff();
    if (bVar1) {
      local_9 = false;
    }
    else {
      if (IsShouldUseColor(bool)::has_color == '\0') {
        iVar2 = __cxa_guard_acquire(&IsShouldUseColor(bool)::has_color);
        if (iVar2 != 0) {
          IsShouldUseColor::has_color = HasColorConsole();
          __cxa_guard_release(&IsShouldUseColor(bool)::has_color);
        }
      }
      local_1e = 0;
      if (use_color) {
        local_1e = IsShouldUseColor::has_color;
      }
      local_9 = (bool)(local_1e & 1);
    }
  }
  return local_9;
}

Assistant:

inline bool iuConsole::IsShouldUseColor(bool use_color)
{
    if( IsColorModeOn() )
    {
        return true;
    }
    else if( IsColorModeOff() )
    {
        return false;
    }
    static bool has_color = HasColorConsole();
    return use_color && has_color;
}